

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O0

int copy_file_data_block(bsdtar *bsdtar,archive *a,archive *in_a,archive_entry *entry)

{
  int iVar1;
  char *pcVar2;
  archive_string_conv *local_78;
  size_t ns;
  int64_t sparse;
  void *pvStack_60;
  int r;
  void *buff;
  char *null_buff;
  int64_t progress;
  int64_t offset;
  ssize_t bytes_written;
  size_t bytes_read;
  archive_entry *entry_local;
  archive *in_a_local;
  archive *a_local;
  bsdtar *bsdtar_local;
  
  null_buff = (char *)0x0;
  buff = (void *)0x0;
  bytes_read = (size_t)entry;
  entry_local = (archive_entry *)in_a;
  in_a_local = a;
  a_local = (archive *)bsdtar;
  while( true ) {
    iVar1 = archive_read_data_block
                      ((archive *)entry_local,&stack0xffffffffffffffa0,(size_t *)&bytes_written,
                       &progress);
    if (iVar1 != 0) {
      if (iVar1 < -0x14) {
        iVar1 = archive_errno(in_a_local);
        pcVar2 = archive_error_string(in_a_local);
        lafe_warnc(iVar1,"%s",pcVar2);
        bsdtar_local._4_4_ = -1;
      }
      else {
        bsdtar_local._4_4_ = 0;
      }
      return bsdtar_local._4_4_;
    }
    iVar1 = need_report();
    if (iVar1 != 0) {
      report_write((bsdtar *)a_local,in_a_local,(archive_entry *)bytes_read,(int64_t)null_buff);
    }
    if ((long)null_buff < progress) {
      ns = progress - (long)null_buff;
      if (buff == (void *)0x0) {
        buff = *(void **)&a_local[1].current_codepage;
        memset(buff,0,(size_t)a_local[1].sconv);
      }
      for (; 0 < (long)ns; ns = ns - offset) {
        if ((long)a_local[1].sconv < (long)ns) {
          local_78 = a_local[1].sconv;
        }
        else {
          local_78 = (archive_string_conv *)ns;
        }
        offset = archive_write_data(in_a_local,buff,(size_t)local_78);
        if (offset < 0) {
          pcVar2 = archive_error_string(in_a_local);
          lafe_warnc(0,"%s",pcVar2);
          return -1;
        }
        if ((ulong)offset < local_78) {
          pcVar2 = archive_entry_pathname((archive_entry *)bytes_read);
          lafe_warnc(0,"%s: Truncated write; file may have grown while being archived.",pcVar2);
          return 0;
        }
        null_buff = null_buff + (long)(((archive_string_conv *)offset)->converter + -10);
      }
    }
    offset = archive_write_data(in_a_local,pvStack_60,bytes_written);
    if (offset < 0) {
      pcVar2 = archive_error_string(in_a_local);
      lafe_warnc(0,"%s",pcVar2);
      return -1;
    }
    if ((ulong)offset < (ulong)bytes_written) break;
    null_buff = null_buff + offset;
  }
  pcVar2 = archive_entry_pathname((archive_entry *)bytes_read);
  lafe_warnc(0,"%s: Truncated write; file may have grown while being archived.",pcVar2);
  return 0;
}

Assistant:

static int
copy_file_data_block(struct bsdtar *bsdtar, struct archive *a,
    struct archive *in_a, struct archive_entry *entry)
{
	size_t	bytes_read;
	ssize_t	bytes_written;
	int64_t	offset, progress = 0;
	char *null_buff = NULL;
	const void *buff;
	int r;

	while ((r = archive_read_data_block(in_a, &buff,
	    &bytes_read, &offset)) == ARCHIVE_OK) {
		if (need_report())
			report_write(bsdtar, a, entry, progress);

		if (offset > progress) {
			int64_t sparse = offset - progress;
			size_t ns;

			if (null_buff == NULL) {
				null_buff = bsdtar->buff;
				memset(null_buff, 0, bsdtar->buff_size);
			}

			while (sparse > 0) {
				if (sparse > (int64_t)bsdtar->buff_size)
					ns = bsdtar->buff_size;
				else
					ns = (size_t)sparse;
				bytes_written =
				    archive_write_data(a, null_buff, ns);
				if (bytes_written < 0) {
					/* Write failed; this is bad */
					lafe_warnc(0, "%s",
					     archive_error_string(a));
					return (-1);
				}
				if ((size_t)bytes_written < ns) {
					/* Write was truncated; warn but
					 * continue. */
					lafe_warnc(0,
					    "%s: Truncated write; file may "
					    "have grown while being archived.",
					    archive_entry_pathname(entry));
					return (0);
				}
				progress += bytes_written;
				sparse -= bytes_written;
			}
		}

		bytes_written = archive_write_data(a, buff, bytes_read);
		if (bytes_written < 0) {
			/* Write failed; this is bad */
			lafe_warnc(0, "%s", archive_error_string(a));
			return (-1);
		}
		if ((size_t)bytes_written < bytes_read) {
			/* Write was truncated; warn but continue. */
			lafe_warnc(0,
			    "%s: Truncated write; file may have grown "
			    "while being archived.",
			    archive_entry_pathname(entry));
			return (0);
		}
		progress += bytes_written;
	}
	if (r < ARCHIVE_WARN) {
		lafe_warnc(archive_errno(a), "%s", archive_error_string(a));
		return (-1);
	}
	return (0);
}